

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth2-client.c
# Opt level: O3

_Bool ssh2_userauth_signflags(ssh2_userauth_state *s,uint *signflags,char **algname)

{
  BinaryPacketProtocol *pBVar1;
  uint uVar2;
  ssh_keyalg *psVar3;
  char *pcVar4;
  uint uVar5;
  
  *signflags = 0;
  psVar3 = find_pubkey_alg(*algname);
  if (psVar3 != (ssh_keyalg *)0x0) {
    uVar2 = (*psVar3->supported_flags)(psVar3);
    pBVar1 = (s->ppl).bpp;
    uVar5 = 4;
    if (((pBVar1->ext_info_rsa_sha512_ok & (byte)((uVar2 & 4) >> 2)) != 0) ||
       (uVar5 = 2, ((byte)((uVar2 & 2) >> 1) & pBVar1->ext_info_rsa_sha256_ok) == 1)) {
      *signflags = uVar5;
      pcVar4 = (*psVar3->alternate_ssh_id)(psVar3,uVar5);
      *algname = pcVar4;
      return true;
    }
  }
  return false;
}

Assistant:

static bool ssh2_userauth_signflags(struct ssh2_userauth_state *s,
                                    unsigned *signflags, const char **algname)
{
    *signflags = 0;                    /* default */

    const ssh_keyalg *alg = find_pubkey_alg(*algname);
    if (!alg)
        return false;          /* we don't know how to upgrade this */

    unsigned supported_flags = ssh_keyalg_supported_flags(alg);

    if (s->ppl.bpp->ext_info_rsa_sha512_ok &&
        (supported_flags & SSH_AGENT_RSA_SHA2_512)) {
        *signflags = SSH_AGENT_RSA_SHA2_512;
    } else if (s->ppl.bpp->ext_info_rsa_sha256_ok &&
               (supported_flags & SSH_AGENT_RSA_SHA2_256)) {
        *signflags = SSH_AGENT_RSA_SHA2_256;
    } else {
        return false;
    }

    *algname = ssh_keyalg_alternate_ssh_id(alg, *signflags);
    return true;
}